

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureDisconnect_ResetOnDisconnectHelper::
initiatorFixtureDisconnect_ResetOnDisconnectHelper
          (initiatorFixtureDisconnect_ResetOnDisconnectHelper *this,TestDetails *details)

{
  initiatorFixture::initiatorFixture(&this->super_initiatorFixture);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
  _vptr_Responder = (_func_int **)&PTR__sessionFixture_00328ab0;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_NullApplication.
  super_Application._vptr_Application =
       (_func_int **)&PTR__initiatorFixtureDisconnect_ResetOnDisconnectHelper_00328b08;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, Disconnect_ResetOnDisconnect) {
  startLoggedOn();

  object->setResetOnDisconnect(true);

  object->setNextSenderMsgSeqNum(20);
  object->setNextTargetMsgSeqNum(20);

  object->disconnect();

  CHECK_EQUAL(1, object->getExpectedSenderNum());
  CHECK_EQUAL(1, object->getExpectedTargetNum());

}